

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b68323::FileSetType::FileSetType
          (FileSetType *this,static_string_view typeName,static_string_view defaultDirectoryProperty
          ,static_string_view defaultPathProperty,static_string_view directoryPrefix,
          static_string_view pathPrefix,static_string_view typeDescription,
          static_string_view defaultDescription,static_string_view arbitraryDescription,
          FileSetEntries *selfEntries,FileSetEntries *interfaceEntries)

{
  FileSetEntries *selfEntries_local;
  FileSetType *this_local;
  static_string_view defaultDirectoryProperty_local;
  static_string_view typeName_local;
  
  (this->TypeName).super_string_view._M_len = typeName.super_string_view._M_len;
  (this->TypeName).super_string_view._M_str = typeName.super_string_view._M_str;
  (this->DefaultDirectoryProperty).super_string_view._M_len =
       defaultDirectoryProperty.super_string_view._M_len;
  (this->DefaultDirectoryProperty).super_string_view._M_str =
       defaultDirectoryProperty.super_string_view._M_str;
  (this->DefaultPathProperty).super_string_view._M_len =
       defaultPathProperty.super_string_view._M_len;
  (this->DefaultPathProperty).super_string_view._M_str =
       defaultPathProperty.super_string_view._M_str;
  (this->DirectoryPrefix).super_string_view._M_len = directoryPrefix.super_string_view._M_len;
  (this->DirectoryPrefix).super_string_view._M_str = directoryPrefix.super_string_view._M_str;
  (this->PathPrefix).super_string_view._M_len = pathPrefix.super_string_view._M_len;
  (this->PathPrefix).super_string_view._M_str = pathPrefix.super_string_view._M_str;
  (this->TypeDescription).super_string_view._M_len = typeDescription.super_string_view._M_len;
  (this->TypeDescription).super_string_view._M_str = typeDescription.super_string_view._M_str;
  (this->DefaultDescription).super_string_view._M_len = defaultDescription.super_string_view._M_len;
  (this->DefaultDescription).super_string_view._M_str = defaultDescription.super_string_view._M_str;
  (this->ArbitraryDescription).super_string_view._M_len =
       arbitraryDescription.super_string_view._M_len;
  (this->ArbitraryDescription).super_string_view._M_str =
       arbitraryDescription.super_string_view._M_str;
  FileSetEntries::FileSetEntries(&this->SelfEntries,selfEntries);
  FileSetEntries::FileSetEntries(&this->InterfaceEntries,interfaceEntries);
  return;
}

Assistant:

FileSetType(cm::static_string_view typeName,
              cm::static_string_view defaultDirectoryProperty,
              cm::static_string_view defaultPathProperty,
              cm::static_string_view directoryPrefix,
              cm::static_string_view pathPrefix,
              cm::static_string_view typeDescription,
              cm::static_string_view defaultDescription,
              cm::static_string_view arbitraryDescription,
              FileSetEntries selfEntries, FileSetEntries interfaceEntries)
    : TypeName(typeName)
    , DefaultDirectoryProperty(defaultDirectoryProperty)
    , DefaultPathProperty(defaultPathProperty)
    , DirectoryPrefix(directoryPrefix)
    , PathPrefix(pathPrefix)
    , TypeDescription(typeDescription)
    , DefaultDescription(defaultDescription)
    , ArbitraryDescription(arbitraryDescription)
    , SelfEntries(std::move(selfEntries))
    , InterfaceEntries(std::move(interfaceEntries))
  {
  }